

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O2

void vfio_enable_dma(int device_fd)

{
  uint __line;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *__assertion;
  vfio_region_info conf_reg;
  uint16_t dma;
  
  iVar1 = ioctl(device_fd,0x3b6c);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    __xpg_strerror_r(iVar1,&dma,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0x23,"vfio_enable_dma","get vfio config region info",&dma);
    exit(iVar1);
  }
  dma = 0;
  sVar2 = pread(device_fd,&dma,2,4);
  if (sVar2 == 2) {
    dma = dma | 4;
    sVar2 = pwrite(device_fd,&dma,2,4);
    if (sVar2 == 2) {
      return;
    }
    __assertion = "pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2";
    __line = 0x27;
  }
  else {
    __assertion = "pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2";
    __line = 0x25;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,__line,"void vfio_enable_dma(int)");
}

Assistant:

void vfio_enable_dma(int device_fd) {
	// write to the command register (offset 4) in the PCIe config space
	int command_register_offset = 4;
	// bit 2 is "bus master enable", see PCIe 3.0 specification section 7.5.1.1
	int bus_master_enable_bit = 2;
	// Get region info for config region
	struct vfio_region_info conf_reg = {.argsz = sizeof(conf_reg)};
	conf_reg.index = VFIO_PCI_CONFIG_REGION_INDEX;
	check_err(ioctl(device_fd, VFIO_DEVICE_GET_REGION_INFO, &conf_reg), "get vfio config region info");
	uint16_t dma = 0;
	assert(pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2);
	dma |= 1 << bus_master_enable_bit;
	assert(pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2);
}